

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexSeparableKernel::splitR(PtexSeparableKernel *this,PtexSeparableKernel *k)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *__src;
  float *pfVar5;
  int iVar6;
  int iVar7;
  
  iVar1 = this->u;
  iVar2 = this->uw;
  iVar7 = (-1 << ((this->res).ulog2 & 0x1fU)) + iVar2 + iVar1;
  iVar3 = this->v;
  iVar4 = this->vw;
  __src = this->ku;
  if (iVar7 < iVar2) {
    pfVar5 = this->kv;
    k->res = this->res;
    k->u = 0;
    k->v = iVar3;
    k->uw = iVar7;
    k->vw = iVar4;
    memcpy(k->kubuff,__src + ((long)iVar2 - (long)iVar7),(long)iVar7 * 4);
    memcpy(k->kvbuff,pfVar5,(long)iVar4 << 2);
    iVar7 = this->uw - iVar7;
    iVar6 = 0;
  }
  else {
    pfVar5 = this->kv;
    iVar6 = this->rot;
    k->res = this->res;
    k->u = iVar1;
    k->v = iVar3;
    k->uw = iVar2;
    k->vw = iVar4;
    memcpy(k->kubuff,__src,(long)iVar2 << 2);
    memcpy(k->kvbuff,pfVar5,(long)iVar4 << 2);
    k->u = (-1 << ((this->res).ulog2 & 0x1fU)) + iVar1;
    this->u = 0;
    iVar7 = 0;
  }
  k->ku = k->kubuff;
  k->kv = k->kvbuff;
  k->rot = iVar6;
  this->uw = iVar7;
  return;
}

Assistant:

void splitR(PtexSeparableKernel& k)
    {
        // split off right piece of width w into k
        int w = u + uw - res.u();

        if (w < uw) {
            // normal case - split off a portion
            //    res  u  v  uw vw  ku           kv
            k.set(res, 0, v, w, vw, ku + uw - w, kv);

            // update local
            uw -= w;
        }
        else {
            // entire kernel is split off
            k = *this;
            k.u -= res.u();
            u = 0; uw = 0;
        }
    }